

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O2

void luaD_reallocstack(lua_State *L,int newsize)

{
  StkId block;
  CallInfo *pCVar1;
  StkId pTVar2;
  GCObject *pGVar3;
  CallInfo **ppCVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  
  if (-2 < newsize) {
    block = L->stack;
    lVar6 = (long)L->stacksize;
    lVar7 = (long)newsize;
    pTVar2 = (StkId)luaM_realloc_(L,block,lVar6 * 0x10,lVar7 * 0x10);
    L->stack = pTVar2;
    piVar5 = &pTVar2[lVar6].tt_;
    for (; lVar6 < lVar7; lVar6 = lVar6 + 1) {
      *piVar5 = 0;
      piVar5 = piVar5 + 4;
    }
    L->stacksize = newsize;
    L->stack_last = pTVar2 + lVar7 + -5;
    L->top = (StkId)(((long)L->top - (long)block) + (long)pTVar2);
    pGVar3 = (GCObject *)&L->openupval;
    while (pGVar3 = (pGVar3->gch).next, pGVar3 != (GCObject *)0x0) {
      (pGVar3->h).metatable =
           (Table *)(((long)(pGVar3->h).metatable - (long)block) + (long)L->stack);
    }
    ppCVar4 = &L->ci;
    while (pCVar1 = *ppCVar4, pCVar1 != (CallInfo *)0x0) {
      pTVar2 = L->stack;
      pCVar1->top = (StkId)(((long)pCVar1->top - (long)block) + (long)pTVar2);
      pCVar1->func = (StkId)(((long)pCVar1->func - (long)block) + (long)pTVar2);
      if ((pCVar1->callstatus & 1) != 0) {
        (pCVar1->u).l.base = (StkId)((long)pTVar2 + ((long)(pCVar1->u).l.base - (long)block));
      }
      ppCVar4 = &pCVar1->previous;
    }
    return;
  }
  luaM_toobig(L);
}

Assistant:

void luaD_reallocstack (lua_State *L, int newsize) {
  TValue *oldstack = L->stack;
  int lim = L->stacksize;
  lua_assert(newsize <= LUAI_MAXSTACK || newsize == ERRORSTACKSIZE);
  lua_assert(L->stack_last - L->stack == L->stacksize - EXTRA_STACK);
  luaM_reallocvector(L, L->stack, L->stacksize, newsize, TValue);
  for (; lim < newsize; lim++)
    setnilvalue(L->stack + lim); /* erase new segment */
  L->stacksize = newsize;
  L->stack_last = L->stack + newsize - EXTRA_STACK;
  correctstack(L, oldstack);
}